

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

void Gia_ParFfSetDefault(Bmc_ParFf_t *p)

{
  Bmc_ParFf_t *p_local;
  
  memset(p,0,0x48);
  p->pFileName = (char *)0x0;
  p->Algo = 0;
  p->fStartPats = 0;
  p->nTimeOut = 0;
  p->nIterCheck = 0;
  p->fBasic = 0;
  p->fFfOnly = 0;
  p->fDump = 0;
  p->fDumpUntest = 0;
  p->fVerbose = 0;
  return;
}

Assistant:

void Gia_ParFfSetDefault( Bmc_ParFf_t * p )
{
    memset( p, 0, sizeof(Bmc_ParFf_t) );
    p->pFileName     =  NULL; 
    p->Algo          =     0; 
    p->fStartPats    =     0; 
    p->nTimeOut      =     0; 
    p->nIterCheck    =     0;
    p->fBasic        =     0; 
    p->fFfOnly       =     0;
    p->fDump         =     0; 
    p->fDumpUntest   =     0; 
    p->fVerbose      =     0; 
}